

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O2

bool bssl::anon_unknown_12::FileTestReadInt<unsigned_short>
               (FileTest *file_test,unsigned_short *out,string *key)

{
  bool bVar1;
  string s;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  bVar1 = FileTest::GetAttribute(file_test,&local_28,key);
  if (bVar1) {
    bVar1 = ParseIntSafe<unsigned_short>(out,&local_28);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool FileTestReadInt(FileTest *file_test, T *out, const std::string &key) {
  std::string s;
  return file_test->GetAttribute(&s, key) && ParseIntSafe(out, s);
}